

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_1U,_4U>::WavingSketch(WavingSketch<8U,_1U,_4U> *this,uint32_t _BUCKET_NUM)

{
  _func_int **pp_Var1;
  clock_t cVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  undefined4 in_ESI;
  Abstract<4U> *in_RDI;
  Abstract<4U> *in_stack_ffffffffffffffb0;
  _func_int **local_48;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffffb0);
  *(undefined ***)&in_RDI->_vptr_Abstract = &PTR_Init_00125a60;
  *(undefined4 *)&in_RDI[1].name = in_ESI;
  *(undefined4 *)&in_RDI[1].field_0xc = 3;
  *(undefined4 *)&in_RDI[1].field_0x10 = 0;
  *(undefined4 *)&in_RDI[1].cr = 0;
  uVar3 = (ulong)*(uint *)&in_RDI[1].name;
  pp_Var1 = (_func_int **)operator_new__(uVar3 * 0x44);
  if (uVar3 != 0) {
    pp_Var4 = (_func_int **)((long)pp_Var1 + uVar3 * 0x44);
    local_48 = pp_Var1;
    do {
      Bucket::Bucket((Bucket *)in_RDI);
      local_48 = (_func_int **)((long)local_48 + 0x44);
    } while (local_48 != pp_Var4);
  }
  in_RDI[1]._vptr_Abstract = pp_Var1;
  std::__cxx11::string::operator=((string *)&in_RDI->name,"WavingSketch");
  memset(in_RDI[1]._vptr_Abstract,0,(ulong)*(uint *)&in_RDI[1].name * 0x44);
  Abstract<4U>::rename(in_RDI,(char *)0x8,(char *)0x1);
  cVar2 = clock();
  *(int *)&in_RDI[1].field_0x24 = (int)cVar2;
  sleep(1);
  cVar2 = clock();
  *(int *)((long)&in_RDI[1].pr + 4) = (int)cVar2;
  sleep(1);
  cVar2 = clock();
  *(int *)&in_RDI[1].pr = (int)cVar2;
  return;
}

Assistant:

WavingSketch(uint32_t _BUCKET_NUM)
		: BUCKET_NUM(_BUCKET_NUM), HASH_NUM(3),
		cnt(0),
		LENGTH(0) {
		buckets = new Bucket[BUCKET_NUM];
		this->name = (char*)"WavingSketch";
		memset(buckets, 0, BUCKET_NUM * sizeof(Bucket));
		this->rename(int(slot_num), int(counter_num));
		seed_choice = std::clock();
		sleep(1);  // need to sleep for a while, or seed_choice and seed_incast
				   // might get the same seed!
		seed_incast = std::clock();
		sleep(1);  // need to sleep for a while, or seed_incast and seed_s might get
				   // the same seed!
		seed_s = std::clock();
	}